

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O3

void __thiscall
Assimp::SMDImporter::ParseVertex
          (SMDImporter *this,char *szCurrent,char **szCurrentOut,Vertex *vertex,bool bVASection)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  byte *pbVar6;
  ulong __new_size;
  pointer ppVar7;
  byte *local_40;
  value_type local_38;
  
  for (; (*szCurrent == 0x20 || (*szCurrent == 9)); szCurrent = (char *)((byte *)szCurrent + 1)) {
  }
  local_40 = (byte *)szCurrent;
  bVar3 = ParseSignedInt(this,szCurrent,(char **)&local_40,(int *)&vertex->iParentNode);
  pbVar6 = local_40;
  if (bVar3) {
    for (; uVar5 = (ulong)*pbVar6, uVar5 < 0x21; pbVar6 = pbVar6 + 1) {
      if ((0x100000200U >> (uVar5 & 0x3f) & 1) == 0) {
        if ((0x3401UL >> (uVar5 & 0x3f) & 1) != 0) {
          LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing vertex.pos.x");
          while( true ) {
            bVar2 = *local_40;
            if ((bVar2 < 0xe) && ((0x2401U >> (bVar2 & 0x1f) & 1) != 0)) break;
            local_40 = local_40 + 1;
          }
          while ((bVar2 == 0xd || (bVar2 == 10))) {
            pbVar6 = local_40 + 1;
            local_40 = local_40 + 1;
            bVar2 = *pbVar6;
          }
          goto LAB_005f72bd;
        }
        break;
      }
    }
    local_40 = (byte *)fast_atoreal_move<float>((char *)pbVar6,(float *)vertex,true);
    for (pbVar6 = local_40; uVar5 = (ulong)*pbVar6, uVar5 < 0x21; pbVar6 = pbVar6 + 1) {
      if ((0x100000200U >> (uVar5 & 0x3f) & 1) == 0) {
        if ((0x3401UL >> (uVar5 & 0x3f) & 1) != 0) {
          LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing vertex.pos.y");
          while( true ) {
            bVar2 = *local_40;
            if ((bVar2 < 0xe) && ((0x2401U >> (bVar2 & 0x1f) & 1) != 0)) break;
            local_40 = local_40 + 1;
          }
          while ((bVar2 == 0xd || (bVar2 == 10))) {
            pbVar6 = local_40 + 1;
            local_40 = local_40 + 1;
            bVar2 = *pbVar6;
          }
          goto LAB_005f72bd;
        }
        break;
      }
    }
    local_40 = (byte *)fast_atoreal_move<float>((char *)pbVar6,&(vertex->pos).y,true);
    for (pbVar6 = local_40; uVar5 = (ulong)*pbVar6, uVar5 < 0x21; pbVar6 = pbVar6 + 1) {
      if ((0x100000200U >> (uVar5 & 0x3f) & 1) == 0) {
        if ((0x3401UL >> (uVar5 & 0x3f) & 1) != 0) {
          LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing vertex.pos.z");
          while( true ) {
            bVar2 = *local_40;
            if ((bVar2 < 0xe) && ((0x2401U >> (bVar2 & 0x1f) & 1) != 0)) break;
            local_40 = local_40 + 1;
          }
          while ((bVar2 == 0xd || (bVar2 == 10))) {
            pbVar6 = local_40 + 1;
            local_40 = local_40 + 1;
            bVar2 = *pbVar6;
          }
          goto LAB_005f72bd;
        }
        break;
      }
    }
    local_40 = (byte *)fast_atoreal_move<float>((char *)pbVar6,&(vertex->pos).z,true);
    for (pbVar6 = local_40; uVar5 = (ulong)*pbVar6, uVar5 < 0x21; pbVar6 = pbVar6 + 1) {
      if ((0x100000200U >> (uVar5 & 0x3f) & 1) == 0) {
        if ((0x3401UL >> (uVar5 & 0x3f) & 1) != 0) {
          LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing vertex.nor.x");
          while( true ) {
            bVar2 = *local_40;
            if ((bVar2 < 0xe) && ((0x2401U >> (bVar2 & 0x1f) & 1) != 0)) break;
            local_40 = local_40 + 1;
          }
          while ((bVar2 == 0xd || (bVar2 == 10))) {
            pbVar6 = local_40 + 1;
            local_40 = local_40 + 1;
            bVar2 = *pbVar6;
          }
          goto LAB_005f72bd;
        }
        break;
      }
    }
    local_40 = (byte *)fast_atoreal_move<float>((char *)pbVar6,&(vertex->nor).x,true);
    for (pbVar6 = local_40; uVar5 = (ulong)*pbVar6, uVar5 < 0x21; pbVar6 = pbVar6 + 1) {
      if ((0x100000200U >> (uVar5 & 0x3f) & 1) == 0) {
        if ((0x3401UL >> (uVar5 & 0x3f) & 1) != 0) {
          LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing vertex.nor.y");
          while( true ) {
            bVar2 = *local_40;
            if ((bVar2 < 0xe) && ((0x2401U >> (bVar2 & 0x1f) & 1) != 0)) break;
            local_40 = local_40 + 1;
          }
          while ((bVar2 == 0xd || (bVar2 == 10))) {
            pbVar6 = local_40 + 1;
            local_40 = local_40 + 1;
            bVar2 = *pbVar6;
          }
          goto LAB_005f72bd;
        }
        break;
      }
    }
    local_40 = (byte *)fast_atoreal_move<float>((char *)pbVar6,&(vertex->nor).y,true);
    for (pbVar6 = local_40; uVar5 = (ulong)*pbVar6, uVar5 < 0x21; pbVar6 = pbVar6 + 1) {
      if ((0x100000200U >> (uVar5 & 0x3f) & 1) == 0) {
        if ((0x3401UL >> (uVar5 & 0x3f) & 1) != 0) {
          LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing vertex.nor.z");
          while( true ) {
            bVar2 = *local_40;
            if ((bVar2 < 0xe) && ((0x2401U >> (bVar2 & 0x1f) & 1) != 0)) break;
            local_40 = local_40 + 1;
          }
          while ((bVar2 == 0xd || (bVar2 == 10))) {
            pbVar6 = local_40 + 1;
            local_40 = local_40 + 1;
            bVar2 = *pbVar6;
          }
          goto LAB_005f72bd;
        }
        break;
      }
    }
    local_40 = (byte *)fast_atoreal_move<float>((char *)pbVar6,&(vertex->nor).z,true);
    if (bVASection) {
      while( true ) {
        bVar2 = *local_40;
        if ((bVar2 < 0xe) && ((0x2401U >> (bVar2 & 0x1f) & 1) != 0)) break;
        local_40 = local_40 + 1;
      }
      while ((bVar2 == 0xd || (bVar2 == 10))) {
        pbVar6 = local_40 + 1;
        local_40 = local_40 + 1;
        bVar2 = *pbVar6;
      }
    }
    else {
      for (pbVar6 = local_40; uVar5 = (ulong)*pbVar6, uVar5 < 0x21; pbVar6 = pbVar6 + 1) {
        if ((0x100000200U >> (uVar5 & 0x3f) & 1) == 0) {
          if ((0x3401UL >> (uVar5 & 0x3f) & 1) != 0) {
            LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing vertex.uv.x");
            while( true ) {
              bVar2 = *local_40;
              if ((bVar2 < 0xe) && ((0x2401U >> (bVar2 & 0x1f) & 1) != 0)) break;
              local_40 = local_40 + 1;
            }
            while ((bVar2 == 0xd || (bVar2 == 10))) {
              pbVar6 = local_40 + 1;
              local_40 = local_40 + 1;
              bVar2 = *pbVar6;
            }
            goto LAB_005f72bd;
          }
          break;
        }
      }
      local_40 = (byte *)fast_atoreal_move<float>((char *)pbVar6,&(vertex->uv).x,true);
      for (pbVar6 = local_40; uVar5 = (ulong)*pbVar6, uVar5 < 0x21; pbVar6 = pbVar6 + 1) {
        if ((0x100000200U >> (uVar5 & 0x3f) & 1) == 0) {
          if ((0x3401UL >> (uVar5 & 0x3f) & 1) != 0) {
            LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing vertex.uv.y");
            while( true ) {
              bVar2 = *local_40;
              if ((bVar2 < 0xe) && ((0x2401U >> (bVar2 & 0x1f) & 1) != 0)) break;
              local_40 = local_40 + 1;
            }
            while ((bVar2 == 0xd || (bVar2 == 10))) {
              pbVar6 = local_40 + 1;
              local_40 = local_40 + 1;
              bVar2 = *pbVar6;
            }
            goto LAB_005f72bd;
          }
          break;
        }
      }
      local_40 = (byte *)fast_atoreal_move<float>((char *)pbVar6,&(vertex->uv).y,true);
      pbVar6 = local_40;
      while( true ) {
        uVar5 = (ulong)*pbVar6;
        if (0x20 < uVar5) break;
        if ((0x100000200U >> (uVar5 & 0x3f) & 1) == 0) {
          if ((0x3401UL >> (uVar5 & 0x3f) & 1) != 0) goto LAB_005f768b;
          break;
        }
        pbVar6 = pbVar6 + 1;
      }
      __new_size = 0;
      if (0xf5 < (byte)(*pbVar6 - 0x3a)) {
        do {
          uVar4 = (uint)(byte)((char)uVar5 - 0x30) + (int)__new_size * 10;
          __new_size = (ulong)uVar4;
          pbVar1 = pbVar6 + 1;
          uVar5 = (ulong)*pbVar1;
          pbVar6 = pbVar6 + 1;
        } while (0xf5 < (byte)(*pbVar1 - 0x3a));
        __new_size = (ulong)uVar4;
      }
      local_38.first = 0;
      local_38.second = 0.0;
      local_40 = pbVar6;
      std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
      ::resize(&vertex->aiBoneLinks,__new_size,&local_38);
      ppVar7 = (vertex->aiBoneLinks).
               super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar6 = local_40;
      if (ppVar7 != (vertex->aiBoneLinks).
                    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
LAB_005f770e:
        do {
          uVar5 = (ulong)*pbVar6;
          if (uVar5 < 0x21) {
            if ((0x100000200U >> (uVar5 & 0x3f) & 1) != 0) {
              pbVar6 = pbVar6 + 1;
              goto LAB_005f770e;
            }
            if ((0x3401UL >> (uVar5 & 0x3f) & 1) != 0) goto LAB_005f77d4;
          }
          uVar4 = 0;
          local_40 = pbVar6;
          if (0xf5 < (byte)(*pbVar6 - 0x3a)) {
            uVar4 = 0;
            do {
              uVar4 = (uint)(byte)((char)uVar5 - 0x30) + uVar4 * 10;
              pbVar6 = local_40 + 1;
              uVar5 = (ulong)*pbVar6;
              local_40 = local_40 + 1;
            } while (0xf5 < (byte)(*pbVar6 - 0x3a));
          }
          ppVar7->first = uVar4;
          for (pbVar6 = local_40; uVar5 = (ulong)*pbVar6, uVar5 < 0x21; pbVar6 = pbVar6 + 1) {
            if ((0x100000200U >> (uVar5 & 0x3f) & 1) == 0) {
              if ((0x3401UL >> (uVar5 & 0x3f) & 1) != 0) goto LAB_005f7803;
              break;
            }
          }
          local_40 = (byte *)fast_atoreal_move<float>((char *)pbVar6,&ppVar7->second,true);
          ppVar7 = ppVar7 + 1;
          pbVar6 = local_40;
        } while (ppVar7 != (vertex->aiBoneLinks).
                           super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      while( true ) {
        bVar2 = *local_40;
        if ((bVar2 < 0xe) && ((0x2401U >> (bVar2 & 0x1f) & 1) != 0)) break;
        local_40 = local_40 + 1;
      }
      while ((bVar2 == 0xd || (bVar2 == 10))) {
        pbVar6 = local_40 + 1;
        local_40 = local_40 + 1;
        bVar2 = *pbVar6;
      }
    }
  }
  else {
    LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing vertex.parent");
    while( true ) {
      bVar2 = *local_40;
      if ((bVar2 < 0xe) && ((0x2401U >> (bVar2 & 0x1f) & 1) != 0)) break;
      local_40 = local_40 + 1;
    }
    while ((bVar2 == 0xd || (bVar2 == 10))) {
      pbVar6 = local_40 + 1;
      local_40 = local_40 + 1;
      bVar2 = *pbVar6;
    }
  }
LAB_005f72bd:
  this->iLineNumber = this->iLineNumber + 1;
  *szCurrentOut = (char *)local_40;
  return;
LAB_005f768b:
  while( true ) {
    bVar2 = *local_40;
    if ((bVar2 < 0xe) && ((0x2401U >> (bVar2 & 0x1f) & 1) != 0)) break;
    local_40 = local_40 + 1;
  }
  while ((bVar2 == 0xd || (bVar2 == 10))) {
    pbVar6 = local_40 + 1;
    local_40 = local_40 + 1;
    bVar2 = *pbVar6;
  }
  goto LAB_005f72bd;
LAB_005f77d4:
  while( true ) {
    bVar2 = *local_40;
    if ((bVar2 < 0xe) && ((0x2401U >> (bVar2 & 0x1f) & 1) != 0)) break;
    local_40 = local_40 + 1;
  }
  while ((bVar2 == 0xd || (bVar2 == 10))) {
    pbVar6 = local_40 + 1;
    local_40 = local_40 + 1;
    bVar2 = *pbVar6;
  }
  goto LAB_005f72bd;
LAB_005f7803:
  while( true ) {
    bVar2 = *local_40;
    if ((bVar2 < 0xe) && ((0x2401U >> (bVar2 & 0x1f) & 1) != 0)) break;
    local_40 = local_40 + 1;
  }
  while ((bVar2 == 0xd || (bVar2 == 10))) {
    pbVar6 = local_40 + 1;
    local_40 = local_40 + 1;
    bVar2 = *pbVar6;
  }
  goto LAB_005f72bd;
}

Assistant:

void SMDImporter::ParseVertex(const char* szCurrent,
        const char** szCurrentOut, SMD::Vertex& vertex,
        bool bVASection /*= false*/) {
    if (SkipSpaces(&szCurrent) && IsLineEnd(*szCurrent)) {
        SkipSpacesAndLineEnd(szCurrent,&szCurrent);
        return ParseVertex(szCurrent,szCurrentOut,vertex,bVASection);
    }
    if(!ParseSignedInt(szCurrent,&szCurrent,(int&)vertex.iParentNode)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.parent");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.pos.x)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.pos.x");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.pos.y)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.pos.y");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.pos.z)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.pos.z");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.nor.x)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.nor.x");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.nor.y)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.nor.y");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.nor.z)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.nor.z");
        SMDI_PARSE_RETURN;
    }

    if (bVASection) {
        SMDI_PARSE_RETURN;
    }

    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.uv.x)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.uv.x");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.uv.y)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.uv.y");
        SMDI_PARSE_RETURN;
    }

    // now read the number of bones affecting this vertex
    // all elements from now are fully optional, we don't need them
    unsigned int iSize = 0;
    if(!ParseUnsignedInt(szCurrent,&szCurrent,iSize)) {
        SMDI_PARSE_RETURN;
    }
    vertex.aiBoneLinks.resize(iSize,std::pair<unsigned int, float>(0,0.0f));

    for (std::vector<std::pair<unsigned int, float> >::iterator
            i =  vertex.aiBoneLinks.begin();
            i != vertex.aiBoneLinks.end();++i) {
        if(!ParseUnsignedInt(szCurrent,&szCurrent,(*i).first)) {
            SMDI_PARSE_RETURN;
        }
        if(!ParseFloat(szCurrent,&szCurrent,(*i).second)) {
            SMDI_PARSE_RETURN;
        }
    }

    // go to the beginning of the next line
    SMDI_PARSE_RETURN;
}